

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_quantize_float(long row,float *fdata,long nxpix,long nypix,int nullcheck,
                       float in_null_value,float qlevel,int dither_method,int *idata,double *bscale,
                       double *bzero,int *iminval,int *imaxval)

{
  float fVar1;
  int iVar2;
  double dVar3;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  LONGLONG iqfactor;
  int nextrand;
  double temp;
  double zeropt;
  double delta;
  float maxval;
  float minval;
  double noise5;
  double noise3;
  double noise2;
  double stdev;
  long ngood;
  long nx;
  long i;
  int iseed;
  int status;
  int dither_method_local;
  float qlevel_local;
  float in_null_value_local;
  int nullcheck_local;
  long nypix_local;
  long nxpix_local;
  float *fdata_local;
  long row_local;
  
  i._0_4_ = 0;
  stdev = 0.0;
  delta._4_4_ = 0.0;
  delta._0_4_ = 0.0;
  iqfactor._4_4_ = 0;
  ngood = nxpix * nypix;
  if (ngood < 2) {
    *bscale = 1.0;
    *bzero = 0.0;
    row_local._4_4_ = 0;
  }
  else {
    iseed = dither_method;
    status = (int)qlevel;
    dither_method_local = (int)in_null_value;
    qlevel_local = (float)nullcheck;
    _in_null_value_local = nypix;
    nypix_local = nxpix;
    nxpix_local = (long)fdata;
    fdata_local = (float *)row;
    if (qlevel < 0.0) {
      zeropt = (double)-qlevel;
      FnNoise3_float(fdata,nxpix,nypix,nullcheck,in_null_value,(long *)&stdev,
                     (float *)((long)&delta + 4),(float *)&delta,(double *)0x0,(int *)((long)&i + 4)
                    );
    }
    else {
      FnNoise5_float(fdata,nxpix,nypix,nullcheck,in_null_value,(long *)&stdev,
                     (float *)((long)&delta + 4),(float *)&delta,&noise3,&noise5,(double *)&maxval,
                     (int *)((long)&i + 4));
      if ((qlevel_local == 0.0) || (stdev != 0.0)) {
        noise2 = noise5;
        if (((noise3 != 0.0) || (NAN(noise3))) && (noise3 < noise5)) {
          noise2 = noise3;
        }
        if (((_maxval != 0.0) || (NAN(_maxval))) && (_maxval < noise2)) {
          noise2 = _maxval;
        }
      }
      else {
        delta._4_4_ = 0.0;
        delta._0_4_ = 1.0;
        noise2 = 1.0;
      }
      if (((float)status != 0.0) || (NAN((float)status))) {
        zeropt = noise2 / (double)(float)status;
      }
      else {
        zeropt = noise2 / 4.0;
      }
      if ((zeropt == 0.0) && (!NAN(zeropt))) {
        return 0;
      }
    }
    if ((double)(delta._0_4_ - delta._4_4_) / zeropt <= 4294967284.0) {
      if (0 < (long)fdata_local) {
        if ((fits_rand_value == (float *)0x0) && (iVar2 = fits_init_randoms(), iVar2 != 0)) {
          return 0x71;
        }
        i._0_4_ = (int)(((long)fdata_local + -1) % 10000);
        iqfactor._4_4_ = (int)(fits_rand_value[(int)i] * 500.0);
      }
      if (stdev == (double)ngood) {
        if (iseed == 2) {
          temp = -zeropt * -2147483637.0 + (double)delta._4_4_;
        }
        else if (2147483637.0 <= (double)(delta._0_4_ - delta._4_4_) / zeropt) {
          temp = (double)(delta._4_4_ + delta._0_4_) / 2.0;
        }
        else {
          temp = (double)(long)((double)delta._4_4_ / zeropt + 0.5) * zeropt;
        }
        if ((long)fdata_local < 1) {
          for (nx = 0; nx < ngood; nx = nx + 1) {
            if (((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt < 0.0) {
              dVar3 = ((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt - 0.5;
            }
            else {
              dVar3 = ((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt + 0.5;
            }
            local_c8 = (int)dVar3;
            idata[nx] = local_c8;
          }
        }
        else {
          for (nx = 0; nx < ngood; nx = nx + 1) {
            if (((iseed != 2) || (fVar1 = *(float *)(nxpix_local + nx * 4), fVar1 != 0.0)) ||
               (NAN(fVar1))) {
              if ((((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt +
                  (double)fits_rand_value[iqfactor._4_4_]) - 0.5 < 0.0) {
                dVar3 = ((((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt +
                         (double)fits_rand_value[iqfactor._4_4_]) - 0.5) - 0.5;
              }
              else {
                dVar3 = ((((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt +
                         (double)fits_rand_value[iqfactor._4_4_]) - 0.5) + 0.5;
              }
              local_c4 = (int)dVar3;
              idata[nx] = local_c4;
            }
            else {
              idata[nx] = -0x7ffffffe;
            }
            iqfactor._4_4_ = iqfactor._4_4_ + 1;
            if (iqfactor._4_4_ == 10000) {
              i._0_4_ = (int)i + 1;
              if ((int)i == 10000) {
                i._0_4_ = 0;
              }
              iqfactor._4_4_ = (int)(fits_rand_value[(int)i] * 500.0);
            }
          }
        }
      }
      else {
        temp = -zeropt * -2147483637.0 + (double)delta._4_4_;
        if ((long)fdata_local < 1) {
          for (nx = 0; nx < ngood; nx = nx + 1) {
            fVar1 = *(float *)(nxpix_local + nx * 4);
            if ((fVar1 != (float)dither_method_local) ||
               (NAN(fVar1) || NAN((float)dither_method_local))) {
              if (((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt < 0.0) {
                dVar3 = ((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt - 0.5;
              }
              else {
                dVar3 = ((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt + 0.5;
              }
              local_d0 = (int)dVar3;
              idata[nx] = local_d0;
            }
            else {
              idata[nx] = -0x7fffffff;
            }
          }
        }
        else {
          for (nx = 0; nx < ngood; nx = nx + 1) {
            fVar1 = *(float *)(nxpix_local + nx * 4);
            if ((fVar1 != (float)dither_method_local) ||
               (NAN(fVar1) || NAN((float)dither_method_local))) {
              if ((iseed != 2) ||
                 ((fVar1 = *(float *)(nxpix_local + nx * 4), fVar1 != 0.0 || (NAN(fVar1))))) {
                if ((((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt +
                    (double)fits_rand_value[iqfactor._4_4_]) - 0.5 < 0.0) {
                  dVar3 = ((((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt +
                           (double)fits_rand_value[iqfactor._4_4_]) - 0.5) - 0.5;
                }
                else {
                  dVar3 = ((((double)*(float *)(nxpix_local + nx * 4) - temp) / zeropt +
                           (double)fits_rand_value[iqfactor._4_4_]) - 0.5) + 0.5;
                }
                local_cc = (int)dVar3;
                idata[nx] = local_cc;
              }
              else {
                idata[nx] = -0x7ffffffe;
              }
            }
            else {
              idata[nx] = -0x7fffffff;
            }
            iqfactor._4_4_ = iqfactor._4_4_ + 1;
            if (iqfactor._4_4_ == 10000) {
              i._0_4_ = (int)i + 1;
              if ((int)i == 10000) {
                i._0_4_ = 0;
              }
              iqfactor._4_4_ = (int)(fits_rand_value[(int)i] * 500.0);
            }
          }
        }
      }
      dVar3 = ((double)delta._4_4_ - temp) / zeropt;
      if (dVar3 < 0.0) {
        dVar3 = dVar3 - 0.5;
      }
      else {
        dVar3 = dVar3 + 0.5;
      }
      local_d4 = (int)dVar3;
      *iminval = local_d4;
      dVar3 = ((double)delta._0_4_ - temp) / zeropt;
      if (dVar3 < 0.0) {
        dVar3 = dVar3 - 0.5;
      }
      else {
        dVar3 = dVar3 + 0.5;
      }
      local_d8 = (int)dVar3;
      *imaxval = local_d8;
      *bscale = zeropt;
      *bzero = temp;
      row_local._4_4_ = 1;
    }
    else {
      row_local._4_4_ = 0;
    }
  }
  return row_local._4_4_;
}

Assistant:

int fits_quantize_float (long row, float fdata[], long nxpix, long nypix, int nullcheck, 
	float in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: if positive, used to calculate random dithering seed value
                       (this is only used when dithering the quantized values)
float fdata[]       i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
float in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2, noise3, noise5;	/* MAD 2nd, 3rd, and 5th order noise values */
	float minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value; /* this is defined in imcompress.c */
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	        if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500.);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
              for (i = 0;  i < nx;  i++) {
	    
		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
 
                 if (fdata[i] != in_null_value) {
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 } else { 
                    idata[i] = NULL_VALUE;
                 }
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;
	return (1);			/* yes, data have been quantized */
}